

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O3

int strpool_decref(strpool_t *pool,unsigned_long_long handle)

{
  int iVar1;
  strpool_internal_entry_t *psVar2;
  
  psVar2 = strpool_internal_get_entry(pool,handle);
  if (psVar2 == (strpool_internal_entry_t *)0x0) {
    iVar1 = 0;
  }
  else {
    if (psVar2->refcount < 1) {
      __assert_fail("( entry->refcount > 0 ) && ( \"Invalid ref count\" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                    ,0x494,"int strpool_decref(strpool_t *, unsigned long long)");
    }
    iVar1 = psVar2->refcount + -1;
    psVar2->refcount = iVar1;
  }
  return iVar1;
}

Assistant:

int strpool_decref( strpool_t* pool, STRPOOL_U64 handle )
    {
    strpool_internal_entry_t* entry = strpool_internal_get_entry( pool, handle );
    if( entry )
        {
        STRPOOL_ASSERT( entry->refcount > 0, "Invalid ref count" );
        --entry->refcount;
        return entry->refcount;
        }
    return 0;
    }